

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall Chainstate::ForceFlushStateToDisk(Chainstate *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *in_stack_ffffffffffffff80;
  _Alloc_hider in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  BlockValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  bVar2 = FlushStateToDisk(this,&state,ALWAYS,0);
  if (!bVar2) {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffff88,
               &state.super_ValidationState<BlockValidationResult>);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "ForceFlushStateToDisk";
    logging_function._M_len = 0x15;
    LogPrintf_<char[22],std::__cxx11::string>
              (logging_function,source_file,0xb76,
               IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|HTTP|TOR,
               (Level)(string *)&stack0xffffffffffffff88,in_stack_ffffffffffffff80,
               (char (*) [22])in_stack_ffffffffffffff88._M_p,in_stack_ffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::ForceFlushStateToDisk()
{
    BlockValidationState state;
    if (!this->FlushStateToDisk(state, FlushStateMode::ALWAYS)) {
        LogPrintf("%s: failed to flush state (%s)\n", __func__, state.ToString());
    }
}